

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

Command * __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::chooseCommandFromMultipleProducers
          (CAPIBuildSystemFrontendDelegate *this,Node *outputNode,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  _func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t
  *p_Var1;
  void *pvVar2;
  CAPIBuildKey *this_00;
  BuildKey *this_01;
  char *pcVar3;
  Command **ppCVar4;
  size_type sVar5;
  StringRef path;
  llb_buildsystem_command_t *command;
  BuildKey local_90;
  CAPIBuildKey *local_70;
  llb_build_key_t *output;
  undefined1 local_58 [8];
  string str;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *commands_local;
  Node *outputNode_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  
  if ((this->cAPIDelegate).choose_command_from_multiple_producers ==
      (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t
       *)0x0) {
    this_local = (CAPIBuildSystemFrontendDelegate *)0x0;
  }
  else {
    str.field_2._8_8_ = commands;
    _output = llbuild::buildsystem::Node::getName(outputNode);
    llvm::StringRef::str_abi_cxx11_((string *)local_58,(StringRef *)&output);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    this_01 = (BuildKey *)std::__cxx11::string::data();
    pcVar3 = (char *)std::__cxx11::string::length();
    path.Length = (size_t)pcVar3;
    path.Data = pcVar3;
    llbuild::buildsystem::BuildKey::makeNode(&local_90,this_01,path);
    CAPIBuildKey::CAPIBuildKey(this_00,&local_90);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_90);
    p_Var1 = (this->cAPIDelegate).choose_command_from_multiple_producers;
    pvVar2 = (this->cAPIDelegate).context;
    local_70 = this_00;
    ppCVar4 = std::
              vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
              ::data(commands);
    sVar5 = std::
            vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ::size(commands);
    this_local = (CAPIBuildSystemFrontendDelegate *)
                 (*p_Var1)(pvVar2,(llb_build_key_t **)&local_70,
                           (llb_buildsystem_command_t **)ppCVar4,sVar5);
    llb_build_key_destroy((llb_build_key_t *)local_70);
    std::__cxx11::string::~string((string *)local_58);
  }
  return (Command *)this_local;
}

Assistant:

virtual Command* chooseCommandFromMultipleProducers(Node* outputNode,
                   std::vector<Command*> commands) override {
    if (cAPIDelegate.choose_command_from_multiple_producers) {
      auto str = outputNode->getName().str();
      auto output = (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeNode(str));

      llb_buildsystem_command_t* command = cAPIDelegate.choose_command_from_multiple_producers(
        cAPIDelegate.context,
        &output,
        (llb_buildsystem_command_t**)commands.data(),
        commands.size()
      );

      llb_build_key_destroy(output);

      return (Command*)command;
    } else {
      return nullptr;
    }
  }